

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

Var Js::Math::Abs(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  CallInfo CVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  ulong uVar6;
  uint64 uVar7;
  uint64 uVar8;
  double value;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo local_50;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != local_50._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x4a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d3f38c;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])local_50;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,&local_50);
  CVar1 = (CallInfo)
          (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x4d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d3f38c;
    *puVar4 = 0;
  }
  if (((ulong)local_68 & 0xfffffe) == 0) {
    pvVar5 = (((ScriptContextBase *)((long)CVar1 + 8))->javascriptLibrary->
             super_JavascriptLibraryBase).nan.ptr;
  }
  else {
    callInfo_local = CVar1;
    pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      args.super_Arguments.Values = (Type)__tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)args.super_Arguments.Values = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d3f38c;
      *(undefined4 *)args.super_Arguments.Values = 0;
    }
    if (((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
      if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00d3f38c;
        *puVar4 = 0;
      }
      CVar1 = callInfo_local;
      if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
        callInfo_local = (CallInfo)(double)(int)pvVar5;
      }
      else if ((ulong)pvVar5 >> 0x32 == 0) {
        callInfo_local =
             (CallInfo)JavascriptConversion::ToNumber_Full(pvVar5,(ScriptContext *)callInfo_local);
      }
      else {
        callInfo_local = (CallInfo)((ulong)pvVar5 ^ 0xfffc000000000000);
      }
      bVar3 = NumberUtilities::IsNan((double)callInfo_local);
      if (bVar3) {
        value = NAN;
      }
      else {
        value = ABS((double)callInfo_local);
      }
      pvVar5 = JavascriptNumber::ToVarNoCheck(value,(ScriptContext *)CVar1);
      return pvVar5;
    }
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d3f38c;
      *puVar4 = 0;
    }
    uVar6 = (ulong)(uint)-(int)pvVar5;
    if (0 < (int)pvVar5) {
      uVar6 = (ulong)pvVar5 & 0xffffffff;
    }
    if ((long)(int)uVar6 == uVar6) {
      pvVar5 = (Var)(uVar6 | 0x1000000000000);
    }
    else {
      callInfo_local = (CallInfo)(double)uVar6;
      uVar7 = NumberUtilities::ToSpecial((double)callInfo_local);
      bVar3 = NumberUtilities::IsNan((double)callInfo_local);
      if (((bVar3) &&
          (uVar8 = NumberUtilities::ToSpecial((double)callInfo_local), uVar8 != 0xfff8000000000000))
         && (uVar8 = NumberUtilities::ToSpecial((double)callInfo_local), uVar8 != 0x7ff8000000000000
            )) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar3) {
LAB_00d3f38c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      pvVar5 = (Var)(uVar7 ^ 0xfffc000000000000);
    }
  }
  return pvVar5;
}

Assistant:

Var Math::Abs(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count >= 2)
        {
            Var arg = args[1];

            if (TaggedInt::Is(arg))
            {
#if defined(TARGET_64)
                __int64 result = ::_abs64(TaggedInt::ToInt32(arg));
#else
                __int32 result = ::abs(TaggedInt::ToInt32(arg));
#endif
                return JavascriptNumber::ToVar(result, scriptContext);
            }

            double x = JavascriptConversion::ToNumber(args[1], scriptContext);

            double result = Math::Abs(x);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            return scriptContext->GetLibrary()->GetNaN();
        }
    }